

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.c
# Opt level: O3

void MCRegisterInfo_InitMCRegisterInfo
               (MCRegisterInfo *RI,MCRegisterDesc *D,uint NR,uint RA,uint PC,MCRegisterClass *C,
               uint NC,uint16_t (*RURoots) [2],uint NRU,MCPhysReg *DL,char *Strings,
               uint16_t *SubIndices,uint NumIndices,uint16_t *RET)

{
  uint in_stack_00000008;
  uint16_t (*in_stack_00000010) [2];
  uint in_stack_00000018;
  undefined4 in_stack_00000024;
  undefined4 in_stack_00000034;
  
  RI->Desc = D;
  RI->NumRegs = NR;
  RI->RAReg = RA;
  RI->PCReg = PC;
  RI->Classes = C;
  RI->DiffLists = (MCPhysReg *)CONCAT44(in_stack_00000024,NC);
  RI->RegStrings = (char *)RURoots;
  RI->SubRegIndices = (uint16_t *)CONCAT44(in_stack_00000034,NRU);
  RI->NumClasses = in_stack_00000008;
  RI->RegUnitRoots = in_stack_00000010;
  RI->NumRegUnits = in_stack_00000018;
  RI->NumSubRegIndices = (uint)DL;
  RI->RegEncodingTable = (uint16_t *)Strings;
  return;
}

Assistant:

void MCRegisterInfo_InitMCRegisterInfo(MCRegisterInfo *RI,
		const MCRegisterDesc *D, unsigned NR,
		unsigned RA, unsigned PC,
		const MCRegisterClass *C, unsigned NC,
		uint16_t (*RURoots)[2], unsigned NRU,
		const MCPhysReg *DL,
		const char *Strings,
		const uint16_t *SubIndices, unsigned NumIndices,
		const uint16_t *RET)
{
	RI->Desc = D;
	RI->NumRegs = NR;
	RI->RAReg = RA;
	RI->PCReg = PC;
	RI->Classes = C;
	RI->DiffLists = DL;
	RI->RegStrings = Strings;
	RI->NumClasses = NC;
	RI->RegUnitRoots = RURoots;
	RI->NumRegUnits = NRU;
	RI->SubRegIndices = SubIndices;
	RI->NumSubRegIndices = NumIndices;
	RI->RegEncodingTable = RET;
}